

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_unlk_32_a7(void)

{
  uint addr_in;
  
  addr_in = m68ki_cpu.dar[0xf];
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68ki_cpu.dar[0xf] = m68k_read_memory_32(addr_in & m68ki_cpu.address_mask);
  return;
}

Assistant:

static void m68k_op_unlk_32_a7(void)
{
	REG_A[7] = m68ki_read_32(REG_A[7]);
}